

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DynamicDescriptorSetAllocator::ReleasePools
          (DynamicDescriptorSetAllocator *this,Uint64 QueueMask)

{
  pointer pVVar1;
  ulong uVar2;
  DescriptorPoolWrapper *Pool;
  pointer Pool_00;
  
  pVVar1 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (Pool_00 = (this->m_AllocatedPools).
                 super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; Pool_00 != pVVar1; Pool_00 = Pool_00 + 1
      ) {
    DescriptorPoolManager::DisposePool(this->m_GlobalPoolMgr,Pool_00,QueueMask);
  }
  uVar2 = ((long)(this->m_AllocatedPools).
                 super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_AllocatedPools).
                super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar2 < this->m_PeakPoolCount) {
    uVar2 = this->m_PeakPoolCount;
  }
  this->m_PeakPoolCount = uVar2;
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::clear(&this->m_AllocatedPools);
  return;
}

Assistant:

void DynamicDescriptorSetAllocator::ReleasePools(Uint64 QueueMask)
{
    for (VulkanUtilities::DescriptorPoolWrapper& Pool : m_AllocatedPools)
    {
        m_GlobalPoolMgr.DisposePool(std::move(Pool), QueueMask);
    }
    m_PeakPoolCount = std::max(m_PeakPoolCount, m_AllocatedPools.size());
    m_AllocatedPools.clear();
}